

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O2

void av1_txb_init_levels_c(tran_low_t *coeff,int width,int height,uint8_t *levels)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint8_t uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar7 = 0;
  memset(levels + (height + 4) * width,0,(long)(height * 4 + 0x20));
  uVar2 = 0;
  if (0 < height) {
    uVar2 = (ulong)(uint)height;
  }
  uVar8 = (ulong)(uint)width;
  if (width < 1) {
    uVar8 = uVar7;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = coeff[uVar4];
      uVar6 = -uVar1;
      if (0 < (int)uVar1) {
        uVar6 = uVar1;
      }
      uVar5 = (uint8_t)uVar6;
      if (0x7e < uVar6) {
        uVar5 = '\x7f';
      }
      levels[uVar4] = uVar5;
    }
    levels = levels + uVar4;
    iVar3 = 4;
    while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
      *levels = '\0';
      levels = levels + 1;
    }
    coeff = coeff + height;
  }
  return;
}

Assistant:

void av1_txb_init_levels_c(const tran_low_t *const coeff, const int width,
                           const int height, uint8_t *const levels) {
  const int stride = height + TX_PAD_HOR;
  uint8_t *ls = levels;

  memset(levels + stride * width, 0,
         sizeof(*levels) * (TX_PAD_BOTTOM * stride + TX_PAD_END));

  for (int i = 0; i < width; i++) {
    for (int j = 0; j < height; j++) {
      *ls++ = (uint8_t)clamp(abs(coeff[i * height + j]), 0, INT8_MAX);
    }
    for (int j = 0; j < TX_PAD_HOR; j++) {
      *ls++ = 0;
    }
  }
}